

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

FISoundChannel * S_GetChannel(void *syschan)

{
  FSoundChan *pFVar1;
  
  pFVar1 = FreeChannels;
  if (FreeChannels == (FSoundChan *)0x0) {
    pFVar1 = (FSoundChan *)operator_new(0x68);
    (pFVar1->super_FISoundChannel).SysChannel = (void *)0x0;
    (pFVar1->super_FISoundChannel).StartTime.AsOne = 0;
    (pFVar1->super_FISoundChannel).Rolloff.RolloffType = 0;
    (pFVar1->super_FISoundChannel).Rolloff.MinDistance = 0.0;
    *(undefined8 *)&(pFVar1->super_FISoundChannel).Rolloff.field_2 = 0;
    (pFVar1->super_FISoundChannel).DistanceSqr = 0.0;
    (pFVar1->super_FISoundChannel).ManualRolloff = false;
    *(undefined3 *)&(pFVar1->super_FISoundChannel).field_0x25 = 0;
    pFVar1->NextChan = (FSoundChan *)0x0;
    pFVar1->PrevChan = (FSoundChan **)0x0;
    pFVar1->SoundID = 0;
    pFVar1->OrgID = 0;
    pFVar1->Volume = 0.0;
    pFVar1->ChanFlags = 0;
    pFVar1->Pitch = 0;
    pFVar1->EntChannel = '\0';
    pFVar1->Priority = '\0';
    pFVar1->NearLimit = 0;
    pFVar1->SourceType = '\0';
    pFVar1->field_0x4f = 0;
    *(undefined8 *)&pFVar1->LimitRange = 0;
    (pFVar1->field_12).Actor = (AActor *)0x0;
    *(undefined8 *)((long)&pFVar1->field_12 + 8) = 0;
  }
  else {
    *FreeChannels->PrevChan = FreeChannels->NextChan;
    if (pFVar1->NextChan != (FSoundChan *)0x0) {
      pFVar1->NextChan->PrevChan = pFVar1->PrevChan;
    }
  }
  pFVar1->NextChan = Channels;
  if (Channels != (FSoundChan *)0x0) {
    Channels->PrevChan = &pFVar1->NextChan;
  }
  Channels = pFVar1;
  pFVar1->PrevChan = &Channels;
  (pFVar1->super_FISoundChannel).SysChannel = syschan;
  return &pFVar1->super_FISoundChannel;
}

Assistant:

FISoundChannel *S_GetChannel(void *syschan)
{
	FSoundChan *chan;

	if (FreeChannels != NULL)
	{
		chan = FreeChannels;
		S_UnlinkChannel(chan);
	}
	else
	{
		chan = new FSoundChan;
		memset(chan, 0, sizeof(*chan));
	}
	S_LinkChannel(chan, &Channels);
	chan->SysChannel = syschan;
	return chan;
}